

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O0

void Ivy_FraigSavePattern(Ivy_FraigMan_t *p)

{
  int *piVar1;
  int iVar2;
  Ivy_Obj_t *pObj_00;
  int local_1c;
  int i;
  Ivy_Obj_t *pObj;
  Ivy_FraigMan_t *p_local;
  
  memset(p->pPatWords,0,(long)p->nPatWords << 2);
  for (local_1c = 0; iVar2 = Vec_PtrSize(p->pManFraig->vPis), local_1c < iVar2;
      local_1c = local_1c + 1) {
    pObj_00 = (Ivy_Obj_t *)Vec_PtrEntry(p->pManFraig->vPis,local_1c);
    piVar1 = p->pSat->model;
    iVar2 = Ivy_ObjSatNum(pObj_00);
    if (piVar1[iVar2] == 1) {
      Ivy_InfoSetBit(p->pPatWords,local_1c);
    }
  }
  return;
}

Assistant:

void Ivy_FraigSavePattern( Ivy_FraigMan_t * p )
{
    Ivy_Obj_t * pObj;
    int i;
    memset( p->pPatWords, 0, sizeof(unsigned) * p->nPatWords );
    Ivy_ManForEachPi( p->pManFraig, pObj, i )
//    Vec_PtrForEachEntry( Ivy_Obj_t *, p->vPiVars, pObj, i )
//        if ( p->pSat->model.ptr[Ivy_ObjSatNum(pObj)] == l_True )
        if ( p->pSat->model[Ivy_ObjSatNum(pObj)] == l_True )
            Ivy_InfoSetBit( p->pPatWords, i );
//            Ivy_InfoSetBit( p->pPatWords, pObj->Id - 1 );
}